

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu.cpp
# Opt level: O0

int __thiscall ncnn::PReLU::forward_inplace(PReLU *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long *in_RSI;
  long lVar7;
  long in_RDI;
  int i_3;
  float slope_2;
  float *ptr_2;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j;
  float slope_1;
  float *ptr_1;
  int i_2;
  int h;
  int w_1;
  int i_1;
  float slope;
  int i;
  float *ptr;
  int w;
  int dims;
  Mat *m;
  float local_24c;
  float local_21c;
  int local_20c;
  int local_1a4;
  int local_190;
  int local_180;
  int local_174;
  int local_16c;
  
  iVar4 = (int)in_RSI[5];
  if (iVar4 == 1) {
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = *in_RSI;
    if (*(int *)(in_RDI + 0xd0) < 2) {
      fVar2 = **(float **)(in_RDI + 0xd8);
      for (local_174 = 0; local_174 < iVar3; local_174 = local_174 + 1) {
        pfVar1 = (float *)(lVar5 + (long)local_174 * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)(lVar5 + (long)local_174 * 4) = fVar2 * *(float *)(lVar5 + (long)local_174 * 4);
        }
      }
    }
    else {
      for (local_16c = 0; local_16c < iVar3; local_16c = local_16c + 1) {
        pfVar1 = (float *)(lVar5 + (long)local_16c * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)(lVar5 + (long)local_16c * 4) =
               *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_16c * 4) *
               *(float *)(lVar5 + (long)local_16c * 4);
        }
      }
    }
  }
  if (iVar4 == 2) {
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    for (local_180 = 0; local_180 < (int)lVar5; local_180 = local_180 + 1) {
      lVar6 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_180 * in_RSI[2];
      if (*(int *)(in_RDI + 0xd0) < 2) {
        local_21c = **(float **)(in_RDI + 0xd8);
      }
      else {
        local_21c = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_180 * 4);
      }
      for (local_190 = 0; local_190 < iVar3; local_190 = local_190 + 1) {
        pfVar1 = (float *)(lVar6 + (long)local_190 * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)(lVar6 + (long)local_190 * 4) =
               local_21c * *(float *)(lVar6 + (long)local_190 * 4);
        }
      }
    }
  }
  if (iVar4 == 3) {
    iVar4 = *(int *)((long)in_RSI + 0x2c);
    lVar5 = in_RSI[6];
    lVar6 = in_RSI[7];
    for (local_1a4 = 0; local_1a4 < (int)lVar6; local_1a4 = local_1a4 + 1) {
      lVar7 = *in_RSI + in_RSI[8] * (long)local_1a4 * in_RSI[2];
      if (*(int *)(in_RDI + 0xd0) < 2) {
        local_24c = **(float **)(in_RDI + 0xd8);
      }
      else {
        local_24c = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_1a4 * 4);
      }
      for (local_20c = 0; local_20c < iVar4 * (int)lVar5; local_20c = local_20c + 1) {
        pfVar1 = (float *)(lVar7 + (long)local_20c * 4);
        if (*pfVar1 <= 0.0 && *pfVar1 != 0.0) {
          *(float *)(lVar7 + (long)local_20c * 4) =
               local_24c * *(float *)(lVar7 + (long)local_20c * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        if (num_slope > 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float slope = slope_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];

            for (int j = 0; j < w; j++)
            {
                if (ptr[j] < 0)
                    ptr[j] *= slope;
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];

            for (int i = 0; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    return 0;
}